

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

value_type * __thiscall
toml::result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
          (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *this,
          source_location loc)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __impl *local_48;
  string local_40;
  
  if (this->is_ok_ != false) {
    return (value_type *)&this->field_1;
  }
  local_48 = loc._M_impl;
  auVar2 = __cxa_allocate_exception(0x28);
  puVar1 = auVar2._0_8_;
  cxx::to_string_abi_cxx11_(&local_40,(cxx *)&local_48,auVar2._8_8_);
  std::operator+(&local_68,"toml::result: bad unwrap",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  *puVar1 = &PTR__bad_result_access_004e1658;
  puVar1[1] = puVar1 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    *(undefined4 *)(puVar1 + 3) = local_68.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar1 + 0x1c) = local_68.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar1 + 4) = local_68.field_2._8_4_;
    *(undefined4 *)((long)puVar1 + 0x24) = local_68.field_2._12_4_;
  }
  else {
    puVar1[1] = local_68._M_dataplus._M_p;
    puVar1[3] = CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                         local_68.field_2._M_allocated_capacity._0_4_);
  }
  puVar1[2] = local_68._M_string_length;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity._0_4_ =
       local_68.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  __cxa_throw(puVar1,&bad_result_access::typeinfo,bad_result_access::~bad_result_access);
}

Assistant:

value_type& unwrap(cxx::source_location loc = cxx::source_location::current())
    {
        if(this->is_err())
        {
            throw bad_result_access("toml::result: bad unwrap" + cxx::to_string(loc));
        }
        return this->succ_.get();
    }